

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unknown_field_set.cc
# Opt level: O3

void __thiscall
google::protobuf::UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet *this,UnknownFieldSet *other)

{
  ulong uVar1;
  int iVar2;
  Arena *pAVar3;
  Arena *pAVar4;
  bool is_soo;
  
  pAVar3 = arena(this);
  pAVar4 = arena(other);
  if (pAVar3 != pAVar4) {
    MergeFrom(this,other);
    return;
  }
  iVar2 = internal::SooRep::size
                    ((SooRep *)this,
                     (undefined1  [16])
                     ((undefined1  [16])(this->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) ==
                     (undefined1  [16])0x0);
  if (iVar2 != 0) {
    RepeatedField<google::protobuf::UnknownField>::MergeFrom(&this->fields_,&other->fields_);
    uVar1 = (other->fields_).soo_rep_.field_0.long_rep.elements_int;
    if ((uVar1 & 4) != 0) {
      internal::LongSooRep::elements((LongSooRep *)other);
    }
    is_soo = (uVar1 & 4) == 0;
    internal::SooRep::size((SooRep *)other,is_soo);
    iVar2 = internal::SooRep::size((SooRep *)other,is_soo);
    if ((iVar2 != 0) &&
       ((undefined1  [16])
        ((undefined1  [16])(other->fields_).soo_rep_.field_0 & (undefined1  [16])0x4) !=
        (undefined1  [16])0x0)) {
      internal::LongSooRep::elements((LongSooRep *)other);
    }
    RepeatedField<google::protobuf::UnknownField>::set_size(&other->fields_,(uVar1 & 4) == 0,0);
    return;
  }
  RepeatedField<google::protobuf::UnknownField>::Swap(&this->fields_,&other->fields_);
  return;
}

Assistant:

void UnknownFieldSet::MergeFromAndDestroy(UnknownFieldSet* other) {
  if (arena() != other->arena()) {
    MergeFrom(*other);
  } else if (fields_.empty()) {
    fields_.Swap(&other->fields_);
  } else {
    fields_.MergeFrom(other->fields_);
    other->fields_.Clear();
  }
}